

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

void lzma_mf_bt4_skip(lzma_mf *mf,uint32_t amount)

{
  byte bVar1;
  uint32_t cur_match_00;
  uint32_t pos_00;
  uint uVar2;
  uint uVar3;
  byte *cur_00;
  uint32_t cur_match;
  uint32_t hash_value;
  uint32_t hash_3_value;
  uint32_t hash_2_value;
  uint32_t temp;
  uint32_t pos;
  uint8_t *cur;
  uint32_t len_limit;
  uint32_t amount_local;
  lzma_mf *mf_local;
  
  cur._4_4_ = amount;
  do {
    cur._0_4_ = mf_avail(mf);
    if ((uint32_t)cur < mf->nice_len) {
      if ((3 < (uint32_t)cur) && (mf->action != LZMA_SYNC_FLUSH)) goto LAB_0070e3ce;
      if (mf->action == LZMA_RUN) {
        __assert_fail("mf->action != LZMA_RUN",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x2d9,"void lzma_mf_bt4_skip(lzma_mf *, uint32_t)");
      }
      move_pending(mf);
    }
    else {
      cur._0_4_ = mf->nice_len;
LAB_0070e3ce:
      cur_00 = mf_ptr(mf);
      pos_00 = mf->read_pos + mf->offset;
      uVar2 = lzma_crc32_table[0][*cur_00] ^ (uint)cur_00[1];
      bVar1 = cur_00[2];
      uVar3 = (uVar2 ^ (uint)cur_00[2] << 8 ^ lzma_crc32_table[0][cur_00[3]] << 5) & mf->hash_mask;
      cur_match_00 = mf->hash[uVar3 + 0x10400];
      mf->hash[uVar2 & 0x3ff] = pos_00;
      mf->hash[((uVar2 ^ (uint)bVar1 << 8) & 0xffff) + 0x400] = pos_00;
      mf->hash[uVar3 + 0x10400] = pos_00;
      bt_skip_func((uint32_t)cur,pos_00,cur_00,cur_match_00,mf->depth,mf->son,mf->cyclic_pos,
                   mf->cyclic_size);
      move_pos(mf);
    }
    cur._4_4_ = cur._4_4_ - 1;
    if (cur._4_4_ == 0) {
      return;
    }
  } while( true );
}

Assistant:

extern void
lzma_mf_bt4_skip(lzma_mf *mf, uint32_t amount)
{
	do {
		header_skip(true, 4);

		hash_4_calc();

		const uint32_t cur_match
				= mf->hash[FIX_4_HASH_SIZE + hash_value];

		mf->hash[hash_2_value] = pos;
		mf->hash[FIX_3_HASH_SIZE + hash_3_value] = pos;
		mf->hash[FIX_4_HASH_SIZE + hash_value] = pos;

		bt_skip();

	} while (--amount != 0);
}